

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::~QTipLabel(QTipLabel *this)

{
  QTipLabel *in_RDI;
  
  ~QTipLabel(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

QTipLabel::~QTipLabel()
{
    instance = nullptr;
}